

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O3

size_t sei_render_size(sei_t *sei)

{
  size_t sVar1;
  sei_message_t *psVar2;
  
  if ((sei == (sei_t *)0x0) || (psVar2 = sei->head, psVar2 == (sei_message_t *)0x0)) {
    sVar1 = 0;
  }
  else {
    sVar1 = 2;
    do {
      sVar1 = (ulong)psVar2->type / 0xff + (psVar2->size << 2) / 3 + psVar2->size / 0xff + sVar1 + 3
      ;
      psVar2 = psVar2->next;
    } while (psVar2 != (_sei_message_t *)0x0);
  }
  return sVar1;
}

Assistant:

size_t sei_render_size(sei_t* sei)
{
    if (!sei || !sei->head) {
        return 0;
    }

    size_t size = 2; // nalu_type + stop bit
    sei_message_t* msg;
    for (msg = sei_message_head(sei); msg; msg = sei_message_next(msg)) {
        size += 1 + (msg->type / 255);
        size += 1 + (msg->size / 255);
        size += 1 + (msg->size * 4 / 3);
    }

    return size;
}